

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O2

Module * soul::Module::createProcessor(Program *p)

{
  uint in_EAX;
  Module *pMVar1;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  pMVar1 = PoolAllocator::allocate<soul::Module,soul::Program&,soul::Module::ModuleType>
                     (&(p->pimpl->allocator).pool,p,(ModuleType *)((long)&uStack_8 + 4));
  return pMVar1;
}

Assistant:

Module& Module::createProcessor (Program& p)    { return p.getAllocator().allocate<Module> (p, ModuleType::processorModule); }